

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O0

void __thiscall indigox::ElectronOpt::SortPotentialLocations(ElectronOpt *this)

{
  MolVertPair id;
  bool bVar1;
  uint8_t uVar2;
  reference ppVar3;
  ElnVertProp *pEVar4;
  element_type *peVar5;
  size_t sVar6;
  iterator iVar7;
  iterator iVar8;
  ulong uVar9;
  size_type sVar10;
  reference ppEVar11;
  reference this_00;
  long in_RDI;
  uint i;
  MolVertProp *propb;
  MolVertProp *propa;
  MolVertProp *prop;
  ElnVertProp *p;
  MolVertPair *vp;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *__range1;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> sortedUniques;
  Atom *in_stack_fffffffffffffcd8;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffce0;
  value_type __p;
  value_type *in_stack_fffffffffffffce8;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> *in_stack_fffffffffffffcf0
  ;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> *this_01;
  ElectronGraph *in_stack_fffffffffffffcf8;
  void *in_stack_fffffffffffffd00;
  void *in_stack_fffffffffffffd08;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> *in_stack_fffffffffffffd10
  ;
  uint local_108;
  __normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
  local_40;
  long local_38;
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> local_20;
  
  std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::vector
            ((vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> *)0x12f794);
  std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::size
            ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
             (in_RDI + 8));
  std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::reserve
            (in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
  local_38 = in_RDI + 8;
  local_40._M_current =
       (pair<void_*,_void_*> *)
       std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::begin
                 ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
                  in_stack_fffffffffffffcd8);
  std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::end
            ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
             in_stack_fffffffffffffcd8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
                        *)in_stack_fffffffffffffce0,
                       (__normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
                        *)in_stack_fffffffffffffcd8);
    if (!bVar1) {
      this_01 = &local_20;
      iVar7 = std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::begin
                        ((vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> *)
                         in_stack_fffffffffffffcd8);
      iVar8 = std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::end
                        ((vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> *)
                         in_stack_fffffffffffffcd8);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<indigox::ElnVertProp**,std::vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>>>,indigox::ElectronOpt::SortPotentialLocations()::__0>
                (iVar7._M_current,iVar8._M_current);
      local_108 = 0;
      while( true ) {
        uVar9 = (ulong)local_108;
        sVar10 = std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::size
                           (&local_20);
        if (sVar10 <= uVar9) break;
        ppEVar11 = std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::
                   operator[](&local_20,(ulong)local_108);
        __p = *ppEVar11;
        this_00 = std::
                  vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::
                  operator[]((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                              *)(in_RDI + 8),(ulong)local_108);
        std::pair<void_*,_void_*>::operator=(this_00,&__p->id);
        local_108 = local_108 + 1;
      }
      std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::~vector(this_01)
      ;
      return;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
             ::operator*(&local_40);
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f841);
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f856);
    id.second = in_stack_fffffffffffffd08;
    id.first = in_stack_fffffffffffffd00;
    ElectronGraph::GetVertex(in_stack_fffffffffffffcf8,id);
    pEVar4 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetProperties(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    if (ppVar3->first == ppVar3->second) {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f8e8);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12f922);
      Atom::GetElement(in_stack_fffffffffffffcd8);
      peVar5 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12f941);
      uVar2 = Element::GetAtomicNumber(peVar5);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12f970);
      switch(uVar2) {
      case '\a':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12f9f5);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = N_ONE;
        }
        else if (sVar6 == 2) {
          pEVar4->sort_score = N_TWO;
        }
        else if (sVar6 == 3) {
          pEVar4->sort_score = N_THREE;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\b':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fa9a);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = O_ONE;
        }
        else if (sVar6 == 2) {
          pEVar4->sort_score = O_TWO;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\t':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fb1e);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = F_ONE;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      default:
        pEVar4->sort_score = UNDEFINED;
        break;
      case '\x0f':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fb81);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = P_ONE;
        }
        else if (sVar6 == 2) {
          pEVar4->sort_score = P_TWO;
        }
        else if (sVar6 == 3) {
          pEVar4->sort_score = P_THREE;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\x10':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fc26);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = S_ONE;
        }
        else if (sVar6 == 2) {
          pEVar4->sort_score = S_ONE;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\x11':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fcaa);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = CL_ONE;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '#':
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fd0a);
        sVar6 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (sVar6 == 1) {
          pEVar4->sort_score = BR_ONE;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
      }
    }
    else {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12fd7e);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12fdbc);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12fdf7);
      Atom::GetElement(in_stack_fffffffffffffcd8);
      peVar5 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12fe16);
      uVar2 = Element::GetAtomicNumber(peVar5);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12fe45);
      switch(uVar2) {
      case '\x06':
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x12fead);
        Atom::GetElement(in_stack_fffffffffffffcd8);
        peVar5 = std::
                 __shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12fecc);
        uVar2 = Element::GetAtomicNumber(peVar5);
        std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12fefb);
        switch(uVar2) {
        case '\x06':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12ff67);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 2) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x12ffa3);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 2) {
              pEVar4->sort_score = C_TWO_C_TWO;
              break;
            }
          }
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12fff4);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 3) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x130030);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 3) {
              pEVar4->sort_score = C_THREE_C_THREE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
          break;
        case '\a':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x130094);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 2) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1300d0);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 1) {
              pEVar4->sort_score = C_TWO_N_ONE;
              break;
            }
          }
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x130121);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 3) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x13015d);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 2) {
              pEVar4->sort_score = C_THREE_N_TWO;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
          break;
        case '\b':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1301c1);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 3) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1301fd);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 1) {
              pEVar4->sort_score = C_THREE_O_ONE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
          break;
        default:
          pEVar4->sort_score = UNDEFINED;
          break;
        case '\x10':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x13025f);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 3) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x13029b);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 1) {
              pEVar4->sort_score = C_THREE_S_ONE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\a':
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x13030a);
        Atom::GetElement(in_stack_fffffffffffffcd8);
        peVar5 = std::
                 __shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x130329);
        uVar2 = Element::GetAtomicNumber(peVar5);
        std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x130358);
        if (uVar2 == '\x06') {
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1303c3);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 1) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1303ff);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 2) {
              pEVar4->sort_score = C_TWO_N_ONE;
              break;
            }
          }
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x130450);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 2) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x13048c);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 3) {
              pEVar4->sort_score = C_THREE_N_TWO;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        else if (uVar2 == '\a') {
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1304f0);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 2) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x13052c);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 2) {
              pEVar4->sort_score = N_TWO_N_TWO;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        else if (uVar2 == '\b') {
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x13058e);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 3) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1305ca);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 1) {
              pEVar4->sort_score = N_THREE_O_ONE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\b':
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x130639);
        Atom::GetElement(in_stack_fffffffffffffcd8);
        peVar5 = std::
                 __shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x130658);
        uVar2 = Element::GetAtomicNumber(peVar5);
        std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x130687);
        switch(uVar2) {
        case '\x06':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1306f3);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 1) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x13072f);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 3) {
              pEVar4->sort_score = C_THREE_O_ONE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
          break;
        case '\a':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x130791);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 1) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1307cd);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 3) {
              pEVar4->sort_score = N_THREE_O_ONE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
          break;
        default:
          pEVar4->sort_score = UNDEFINED;
          break;
        case '\x0f':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x13082f);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 1) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x130865);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 4) {
              pEVar4->sort_score = O_ONE_P_FOUR;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
          break;
        case '\x10':
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1308c1);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 1) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1308f7);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 4) {
              pEVar4->sort_score = O_ONE_S_FOUR;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      default:
        pEVar4->sort_score = UNDEFINED;
        break;
      case '\x0f':
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x130960);
        Atom::GetElement(in_stack_fffffffffffffcd8);
        peVar5 = std::
                 __shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13097f);
        uVar2 = Element::GetAtomicNumber(peVar5);
        std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x13099a);
        if (uVar2 == '\b') {
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1309de);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 4) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x130a14);
            sVar6 = utils::
                    Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (sVar6 == 1) {
              pEVar4->sort_score = O_ONE_P_FOUR;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
        break;
      case '\x10':
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x130a7d);
        Atom::GetElement(in_stack_fffffffffffffcd8);
        peVar5 = std::
                 __shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x130a9c);
        uVar2 = Element::GetAtomicNumber(peVar5);
        std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x130ac2);
        if (uVar2 == '\x06') {
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x130b15);
          sVar6 = utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                            *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (sVar6 == 1) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x130b4b);
            in_stack_fffffffffffffd08 =
                 (void *)utils::
                         Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                         ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                                   *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (in_stack_fffffffffffffd08 == (void *)0x3) {
              pEVar4->sort_score = C_THREE_S_ONE;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        else if (uVar2 == '\b') {
          std::
          __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x130ba7);
          in_stack_fffffffffffffd00 =
               (void *)utils::
                       Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                       ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                                 *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (in_stack_fffffffffffffd00 == (void *)0x4) {
            std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x130bdd);
            in_stack_fffffffffffffcf8 =
                 (ElectronGraph *)
                 utils::
                 Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                 ::Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                           *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (in_stack_fffffffffffffcf8 == (ElectronGraph *)0x1) {
              pEVar4->sort_score = O_ONE_S_FOUR;
              break;
            }
          }
          pEVar4->sort_score = UNDEFINED;
        }
        else {
          pEVar4->sort_score = UNDEFINED;
        }
      }
    }
    std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::push_back
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    __gnu_cxx::
    __normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

void ElectronOpt::SortPotentialLocations() {
  std::vector<ElnVertProp*> sortedUniques;
  sortedUniques.reserve(possibleLocations_.size());
  for (MolVertPair& vp : possibleLocations_) {
    ElnVertProp* p = elnGraph_->GetProperties(elnGraph_->GetVertex(vp));
    if (vp.first == vp.second) {
      MolVertProp* prop = molGraph_->GetProperties(vp.first);
      switch (prop->atom->GetElement()->GetAtomicNumber()) {
        case 7:  // Nitrogen
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::N_ONE; break;
            case 2: p->sort_score = SortOrder::N_TWO; break;
            case 3: p->sort_score = SortOrder::N_THREE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 8:  // Oxygen
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::O_ONE; break;
            case 2: p->sort_score = SortOrder::O_TWO; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 9:  // Fluorine
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::F_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 15:  // Phosphorus
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::P_ONE; break;
            case 2: p->sort_score = SortOrder::P_TWO; break;
            case 3: p->sort_score = SortOrder::P_THREE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 16:  // Sulfur
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::S_ONE; break;
            case 2: p->sort_score = SortOrder::S_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 17:  // Chlorine
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::CL_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 35:
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::BR_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        default: p->sort_score = SortOrder::UNDEFINED; break;
      }
    } else {
      MolVertProp* propa = molGraph_->GetProperties(vp.first);
      MolVertProp* propb = molGraph_->GetProperties(vp.second);
      switch (propa->atom->GetElement()->GetAtomicNumber()) {
        case 6:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_TWO_C_TWO;
              else if (molGraph_->Degree(vp.first) == 3
                    && molGraph_->Degree(vp.second) == 3)
                  p->sort_score = SortOrder::C_THREE_C_THREE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_TWO_N_ONE;
              else if (molGraph_->Degree(vp.first) == 3
                       && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_THREE_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 16:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_THREE_S_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 7:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_TWO_N_ONE;
              else if (molGraph_->Degree(vp.first) == 2
                       && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::N_TWO_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::N_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 8:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::N_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 15:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 4)
                p->sort_score = SortOrder::O_ONE_P_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 16:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 4)
                p->sort_score = SortOrder::O_ONE_S_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 15:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 8:
              if (molGraph_->Degree(vp.first) == 4
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::O_ONE_P_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 16:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_S_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 4
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::O_ONE_S_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        default: p->sort_score = SortOrder::UNDEFINED; break;
      }
    }
    
    sortedUniques.push_back(p);
  }
  std::stable_sort(sortedUniques.begin(), sortedUniques.end(),
                   [](const ElnVertProp* lhs, const ElnVertProp* rhs) {
                     if (opt_::ALGORITHM == opt_::Algorithm::ASTAR)
                       return lhs->sort_score < rhs->sort_score;
                     else return lhs->sort_score > rhs->sort_score;
                   });
  
  for (unsigned int i = 0; i < sortedUniques.size(); ++i)
    possibleLocations_[i] = sortedUniques[i]->id;
}